

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_stbvorbis_read_pcm_frames
                    (ma_stbvorbis *pVorbis,void *pFramesOut,ma_uint64 frameCount,
                    ma_uint64 *pFramesRead)

{
  ma_uint32 *pmVar1;
  size_t *psVar2;
  uint uVar3;
  uint uVar4;
  ma_uint32 channels;
  float **ppfVar5;
  _func_void_ptr_void_ptr_size_t_void_ptr *p_Var6;
  ma_result mVar7;
  int iVar8;
  ma_result mVar9;
  ulong uVar10;
  ulong uVar11;
  ma_uint8 *pmVar12;
  size_t __n;
  float *pFramesOutF32;
  ma_uint64 framesRemaining;
  ulong uVar13;
  ulong uVar14;
  size_t sVar15;
  ma_uint64 mVar16;
  bool bVar17;
  int samplesRead;
  size_t bytesRead;
  ma_uint32 local_54;
  ulong local_50;
  void *local_48;
  ma_uint64 *local_40;
  size_t local_38;
  
  if (pFramesRead != (ma_uint64 *)0x0) {
    *pFramesRead = 0;
  }
  mVar7 = MA_INVALID_ARGS;
  if (pVorbis != (ma_stbvorbis *)0x0 && frameCount != 0) {
    local_40 = pFramesRead;
    if (pVorbis->format == ma_format_f32) {
      local_50 = frameCount;
      local_48 = pFramesOut;
      if (pVorbis->usingPushMode == 0) {
        channels = pVorbis->channels;
        mVar9 = MA_SUCCESS;
        mVar16 = 0;
        do {
          uVar10 = local_50 - mVar16;
          if (local_50 < mVar16 || uVar10 == 0) break;
          if (0x7ffffffe < uVar10) {
            uVar10 = 0x7fffffff;
          }
          iVar8 = stb_vorbis_get_samples_float_interleaved
                            (pVorbis->stb,channels,
                             (float *)((channels * 4) * mVar16 + (long)local_48),
                             channels * (int)uVar10);
          mVar16 = mVar16 + (long)iVar8;
        } while ((int)uVar10 <= iVar8);
      }
      else {
        mVar16 = 0;
        mVar9 = MA_SUCCESS;
        do {
          uVar10 = local_50 - mVar16;
          if (local_50 < mVar16 || uVar10 == 0) break;
          uVar3 = (pVorbis->push).framesRemaining;
          uVar11 = uVar10 & 0xffffffff;
          if (uVar3 < uVar10) {
            uVar11 = (ulong)uVar3;
          }
          iVar8 = (int)uVar11;
          if ((local_48 != (void *)0x0) && (iVar8 != 0)) {
            uVar10 = (ulong)pVorbis->channels;
            uVar13 = 0;
            do {
              if (uVar10 != 0) {
                ppfVar5 = (pVorbis->push).ppPacketData;
                uVar4 = (pVorbis->push).framesConsumed;
                uVar14 = 0;
                do {
                  *(float *)((long)pFramesOut + uVar14 * 4) = ppfVar5[uVar14][uVar13 + uVar4];
                  uVar14 = uVar14 + 1;
                } while (uVar10 != uVar14);
              }
              pFramesOut = (void *)((long)pFramesOut + uVar10 * 4);
              uVar13 = uVar13 + 1;
            } while (uVar13 != uVar11);
          }
          pmVar1 = &(pVorbis->push).framesConsumed;
          *pmVar1 = *pmVar1 + iVar8;
          (pVorbis->push).framesRemaining = uVar3 - iVar8;
          mVar16 = mVar16 + uVar11;
          if (mVar16 == local_50) {
            bVar17 = false;
          }
          else {
            do {
              local_54 = 0;
              uVar10 = (pVorbis->push).dataSize;
              if (uVar10 < 0x80000000) {
                iVar8 = stb_vorbis_decode_frame_pushdata
                                  (pVorbis->stb,(pVorbis->push).pData,(int)uVar10,(int *)0x0,
                                   &(pVorbis->push).ppPacketData,(int *)&local_54);
                if (iVar8 != 0) {
                  pmVar12 = (pVorbis->push).pData;
                  __n = (pVorbis->push).dataSize - (long)iVar8;
                  (pVorbis->push).dataSize = __n;
                  memmove(pmVar12,pmVar12 + iVar8,__n);
                  (pVorbis->push).framesConsumed = 0;
                  (pVorbis->push).framesRemaining = local_54;
                  goto LAB_0016f666;
                }
                sVar15 = (pVorbis->push).dataCapacity;
                if (sVar15 == (pVorbis->push).dataSize) {
                  sVar15 = sVar15 + 0x1000;
                  p_Var6 = (pVorbis->allocationCallbacks).onRealloc;
                  if (p_Var6 == (_func_void_ptr_void_ptr_size_t_void_ptr *)0x0) {
                    pmVar12 = (ma_uint8 *)0x0;
                  }
                  else {
                    pmVar12 = (ma_uint8 *)
                              (*p_Var6)((pVorbis->push).pData,sVar15,
                                        (pVorbis->allocationCallbacks).pUserData);
                  }
                  if (pmVar12 != (ma_uint8 *)0x0) {
                    (pVorbis->push).pData = pmVar12;
                    (pVorbis->push).dataCapacity = sVar15;
                    goto LAB_0016f6cc;
                  }
                  mVar9 = MA_OUT_OF_MEMORY;
                  mVar7 = ~MA_TOO_BIG;
                }
                else {
LAB_0016f6cc:
                  sVar15 = (pVorbis->push).dataSize;
                  mVar9 = (*pVorbis->onRead)(pVorbis->pReadSeekTellUserData,
                                             (pVorbis->push).pData + sVar15,
                                             (pVorbis->push).dataCapacity - sVar15,&local_38);
                  psVar2 = &(pVorbis->push).dataSize;
                  *psVar2 = *psVar2 + local_38;
                  mVar7 = mVar9;
                  if (mVar9 != MA_SUCCESS) {
                    mVar7 = ~MA_TOO_BIG;
                  }
                }
                bVar17 = mVar7 == MA_SUCCESS;
              }
              else {
LAB_0016f666:
                bVar17 = false;
              }
            } while (bVar17);
            bVar17 = mVar9 == MA_SUCCESS;
          }
        } while (bVar17);
      }
    }
    else {
      mVar16 = 0;
      mVar9 = MA_INVALID_ARGS;
    }
    pVorbis->cursor = pVorbis->cursor + mVar16;
    mVar7 = MA_AT_END;
    if (mVar16 != 0) {
      mVar7 = mVar9;
    }
    if (local_40 != (ma_uint64 *)0x0) {
      *local_40 = mVar16;
    }
  }
  return mVar7;
}

Assistant:

MA_API ma_result ma_stbvorbis_read_pcm_frames(ma_stbvorbis* pVorbis, void* pFramesOut, ma_uint64 frameCount, ma_uint64* pFramesRead)
{
    if (pFramesRead != NULL) {
        *pFramesRead = 0;
    }

    if (frameCount == 0) {
        return MA_INVALID_ARGS;
    }

    if (pVorbis == NULL) {
        return MA_INVALID_ARGS;
    }

    #if !defined(MA_NO_VORBIS)
    {
        /* We always use floating point format. */
        ma_result result = MA_SUCCESS;  /* Must be initialized to MA_SUCCESS. */
        ma_uint64 totalFramesRead = 0;
        ma_format format;
        ma_uint32 channels;

        ma_stbvorbis_get_data_format(pVorbis, &format, &channels, NULL, NULL, 0);

        if (format == ma_format_f32) {
            /* We read differently depending on whether or not we're using push mode. */
            if (pVorbis->usingPushMode) {
                /* Push mode. This is the complex case. */
                float* pFramesOutF32 = (float*)pFramesOut;

                while (totalFramesRead < frameCount) {
                    /* The first thing to do is read from any already-cached frames. */
                    ma_uint32 framesToReadFromCache = (ma_uint32)ma_min(pVorbis->push.framesRemaining, (frameCount - totalFramesRead));  /* Safe cast because pVorbis->framesRemaining is 32-bit. */

                    /* The output pointer can be null in which case we just treat it as a seek. */
                    if (pFramesOut != NULL) {
                        ma_uint64 iFrame;
                        for (iFrame = 0; iFrame < framesToReadFromCache; iFrame += 1) {
                            ma_uint32 iChannel;
                            for (iChannel = 0; iChannel < pVorbis->channels; iChannel += 1) {
                                pFramesOutF32[iChannel] = pVorbis->push.ppPacketData[iChannel][pVorbis->push.framesConsumed + iFrame];
                            }

                            pFramesOutF32 += pVorbis->channels;
                        }
                    }

                    /* Update pointers and counters. */
                    pVorbis->push.framesConsumed  += framesToReadFromCache;
                    pVorbis->push.framesRemaining -= framesToReadFromCache;
                    totalFramesRead               += framesToReadFromCache;

                    /* Don't bother reading any more frames right now if we've just finished loading. */
                    if (totalFramesRead == frameCount) {
                        break;
                    }

                    MA_ASSERT(pVorbis->push.framesRemaining == 0);

                    /* Getting here means we've run out of cached frames. We'll need to load some more. */
                    for (;;) {
                        int samplesRead = 0;
                        int consumedDataSize;

                        /* We need to case dataSize to an int, so make sure we can do it safely. */
                        if (pVorbis->push.dataSize > INT_MAX) {
                            break;  /* Too big. */
                        }

                        consumedDataSize = stb_vorbis_decode_frame_pushdata(pVorbis->stb, pVorbis->push.pData, (int)pVorbis->push.dataSize, NULL, &pVorbis->push.ppPacketData, &samplesRead);
                        if (consumedDataSize != 0) {
                            /* Successfully decoded a Vorbis frame. Consume the data. */
                            pVorbis->push.dataSize -= (size_t)consumedDataSize;
                            MA_MOVE_MEMORY(pVorbis->push.pData, ma_offset_ptr(pVorbis->push.pData, consumedDataSize), pVorbis->push.dataSize);

                            pVorbis->push.framesConsumed  = 0;
                            pVorbis->push.framesRemaining = samplesRead;

                            break;
                        } else {
                            /* Not enough data. Read more. */
                            size_t bytesRead;

                            /* Expand the data buffer if necessary. */
                            if (pVorbis->push.dataCapacity == pVorbis->push.dataSize) {
                                size_t newCap = pVorbis->push.dataCapacity + MA_VORBIS_DATA_CHUNK_SIZE;
                                ma_uint8* pNewData;

                                pNewData = (ma_uint8*)ma_realloc(pVorbis->push.pData, newCap, &pVorbis->allocationCallbacks);
                                if (pNewData == NULL) {
                                    result = MA_OUT_OF_MEMORY;
                                    break;
                                }

                                pVorbis->push.pData = pNewData;
                                pVorbis->push.dataCapacity = newCap;
                            }

                            /* We should have enough room to load some data. */
                            result = pVorbis->onRead(pVorbis->pReadSeekTellUserData, ma_offset_ptr(pVorbis->push.pData, pVorbis->push.dataSize), (pVorbis->push.dataCapacity - pVorbis->push.dataSize), &bytesRead);
                            pVorbis->push.dataSize += bytesRead;

                            if (result != MA_SUCCESS) {
                                break;  /* Failed to read any data. Get out. */
                            }
                        }
                    }

                    /* If we don't have a success code at this point it means we've encountered an error or the end of the file has been reached (probably the latter). */
                    if (result != MA_SUCCESS) {
                        break;
                    }
                }
            } else {
                /* Pull mode. This is the simple case, but we still need to run in a loop because stb_vorbis loves using 32-bit instead of 64-bit. */
                while (totalFramesRead < frameCount) {
                    ma_uint64 framesRemaining = (frameCount - totalFramesRead);
                    int framesRead;

                    if (framesRemaining > INT_MAX) {
                        framesRemaining = INT_MAX;
                    }

                    framesRead = stb_vorbis_get_samples_float_interleaved(pVorbis->stb, channels, (float*)ma_offset_pcm_frames_ptr(pFramesOut, totalFramesRead, format, channels), (int)framesRemaining * channels);   /* Safe cast. */
                    totalFramesRead += framesRead;

                    if (framesRead < (int)framesRemaining) {
                        break;  /* Nothing left to read. Get out. */
                    }
                }
            }
        } else {
            result = MA_INVALID_ARGS;
        }

        pVorbis->cursor += totalFramesRead;

        if (totalFramesRead == 0) {
            result = MA_AT_END;
        }

        if (pFramesRead != NULL) {
            *pFramesRead = totalFramesRead;
        }

        if (result == MA_SUCCESS && totalFramesRead == 0) {
            result  = MA_AT_END;
        }

        return result;
    }
    #else
    {
        /* vorbis is disabled. Should never hit this since initialization would have failed. */
        MA_ASSERT(MA_FALSE);

        (void)pFramesOut;
        (void)frameCount;
        (void)pFramesRead;

        return MA_NOT_IMPLEMENTED;
    }
    #endif
}